

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

ProgramContext * __thiscall
deqp::gles3::Performance::ShaderCompilerMandelbrotCase::generateShaderData
          (ProgramContext *__return_storage_ptr__,ShaderCompilerMandelbrotCase *this,
          int measurementNdx)

{
  deUint32 id;
  int numFractalIterations;
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  local_108;
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  local_f0;
  string local_d8;
  string local_b8;
  string local_88;
  string local_68;
  undefined1 local_41;
  undefined1 local_40 [8];
  string nameSpec;
  deUint32 specID;
  int measurementNdx_local;
  ShaderCompilerMandelbrotCase *this_local;
  ProgramContext *result;
  
  nameSpec.field_2._12_4_ = measurementNdx;
  nameSpec.field_2._8_4_ =
       ShaderCompilerCase::getSpecializationID(&this->super_ShaderCompilerCase,measurementNdx);
  getNameSpecialization_abi_cxx11_
            ((string *)local_40,(Performance *)(ulong)(uint)nameSpec.field_2._8_4_,id);
  local_41 = 0;
  ShaderCompilerCase::ProgramContext::ProgramContext(__return_storage_ptr__);
  mandelbrotVertexTemplate_abi_cxx11_();
  specializeShaderSource(&local_68,&local_88,nameSpec.field_2._8_4_,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  mandelbrotFragmentTemplate_abi_cxx11_
            (&local_d8,(Performance *)(ulong)(uint)this->m_numFractalIterations,numFractalIterations
            );
  specializeShaderSource(&local_b8,&local_d8,nameSpec.field_2._8_4_,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->fragShaderSource,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  mandelbrotShaderAttributes(&local_f0,(string *)local_40);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::operator=(&__return_storage_ptr__->vertexAttributes,&local_f0);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector(&local_f0);
  mandelbrotShaderUniforms(&local_108,(string *)local_40);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ::operator=(&__return_storage_ptr__->uniforms,&local_108);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ::~vector(&local_108);
  local_41 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

ShaderCompilerCase::ProgramContext ShaderCompilerMandelbrotCase::generateShaderData (int measurementNdx) const
{
	deUint32		specID		= getSpecializationID(measurementNdx);
	string			nameSpec	= getNameSpecialization(specID);
	ProgramContext	result;

	result.vertShaderSource = specializeShaderSource(mandelbrotVertexTemplate(), specID, SHADER_VALIDITY_VALID);
	result.fragShaderSource = specializeShaderSource(mandelbrotFragmentTemplate(m_numFractalIterations), specID, SHADER_VALIDITY_VALID);

	result.vertexAttributes = mandelbrotShaderAttributes(nameSpec);
	result.uniforms = mandelbrotShaderUniforms(nameSpec);

	return result;
}